

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessVertexArraysTests.cpp
# Opt level: O0

IterateResult __thiscall
gl4cts::DirectStateAccess::VertexArrays::ElementBufferErrorsTest::iterate
          (ElementBufferErrorsTest *this)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  ContextInfo *this_00;
  int local_40;
  int local_3c;
  GLuint not_a_bo;
  GLuint bo;
  GLuint not_a_vao;
  GLuint vao;
  bool is_error;
  bool is_ok;
  ApiType AStack_28;
  bool is_arb_direct_state_access;
  byte local_21;
  long lStack_20;
  bool is_at_least_gl_45;
  Functions *gl;
  ElementBufferErrorsTest *this_local;
  
  gl = (Functions *)this;
  pRVar5 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*pRVar5->_vptr_RenderContext[3])();
  lStack_20 = CONCAT44(extraout_var,iVar3);
  pRVar5 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  AStack_28.m_bits = (*pRVar5->_vptr_RenderContext[2])();
  vao = (GLuint)glu::ApiType::core(4,5);
  local_21 = glu::contextSupports((ContextType)AStack_28.m_bits,(ApiType)vao);
  this_00 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  not_a_vao._3_1_ = glu::ContextInfo::isExtensionSupported(this_00,"GL_ARB_direct_state_access");
  if (((local_21 & 1) != 0) || ((bool)not_a_vao._3_1_)) {
    not_a_vao._2_1_ = 1;
    not_a_vao._1_1_ = 0;
    bo = 0;
    not_a_bo = 0;
    local_3c = 0;
    local_40 = 0;
    (**(code **)(lStack_20 + 0x410))(1,&bo);
    dVar4 = (**(code **)(lStack_20 + 0x800))();
    glu::checkError(dVar4,"glCreateVertexArrays call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                    ,0x1135);
    (**(code **)(lStack_20 + 0x3b8))(1,&local_3c);
    dVar4 = (**(code **)(lStack_20 + 0x800))();
    glu::checkError(dVar4,"glCreateBuffers call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                    ,0x1138);
    do {
      not_a_bo = not_a_bo + 1;
      cVar1 = (**(code **)(lStack_20 + 0xcd8))();
    } while (cVar1 != '\0');
    do {
      local_40 = local_40 + 1;
      cVar1 = (**(code **)(lStack_20 + 0xc68))();
    } while (cVar1 != '\0');
    (**(code **)(lStack_20 + 0x16e0))(not_a_bo,local_3c);
    bVar2 = CheckError(this,0x502,
                       "INVALID_OPERATION error was not generated by VertexArrayElementBuffer if vaobj is not the name of an existing vertex array object."
                      );
    not_a_vao._2_1_ = bVar2 & not_a_vao._2_1_;
    (**(code **)(lStack_20 + 0x16e0))(bo,local_40);
    bVar2 = CheckError(this,0x502,
                       "INVALID_OPERATION error is generated by VertexArrayElementBuffer if buffer is not zero or the name of an existing buffer object."
                      );
    not_a_vao._2_1_ = (not_a_vao._2_1_ & 1 & bVar2) != 0;
    if (bo != 0) {
      (**(code **)(lStack_20 + 0x490))(1);
    }
    if (local_3c != 0) {
      (**(code **)(lStack_20 + 0x438))(1);
    }
    do {
      iVar3 = (**(code **)(lStack_20 + 0x800))();
    } while (iVar3 != 0);
    if ((not_a_vao._2_1_ & 1) == 0) {
      if ((not_a_vao._1_1_ & 1) == 0) {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Fail");
      }
      else {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_INTERNAL_ERROR,"Error");
      }
    }
    else {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
    }
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_NOT_SUPPORTED,"Not Supported");
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult ElementBufferErrorsTest::iterate()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	/* Tested Objects. */
	glw::GLuint vao		  = 0;
	glw::GLuint not_a_vao = 0;
	glw::GLuint bo		  = 0;
	glw::GLuint not_a_bo  = 0;

	try
	{
		/* Prepare valid Objects. */
		gl.createVertexArrays(1, &vao);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateVertexArrays call failed.");

		gl.createBuffers(1, &bo);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateBuffers call failed.");

		/* Prepare invalid VAO. */
		while (gl.isVertexArray(++not_a_vao))
			;
		while (gl.isBuffer(++not_a_bo))
			;

		/* Test not a VAO. */
		gl.vertexArrayElementBuffer(not_a_vao, bo);

		is_ok &=
			CheckError(GL_INVALID_OPERATION, "INVALID_OPERATION error was not generated by VertexArrayElementBuffer if "
											 "vaobj is not the name of an existing vertex array object.");

		/* Test not a BO. */
		gl.vertexArrayElementBuffer(vao, not_a_bo);

		is_ok &= CheckError(GL_INVALID_OPERATION, "INVALID_OPERATION error is generated by VertexArrayElementBuffer if "
												  "buffer is not zero or the name of an existing buffer object.");
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Clean up. */
	if (vao)
	{
		gl.deleteVertexArrays(1, &vao);
	}

	if (bo)
	{
		gl.deleteBuffers(1, &bo);
	}

	/* Errors clean up. */
	while (gl.getError())
		;

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}